

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O0

void __thiscall imrt::ACS::calculateProbability(ACS *this)

{
  int iVar1;
  reference pvVar2;
  double *pdVar3;
  mapped_type *pmVar4;
  long in_RDI;
  double dVar5;
  double dVar6;
  int r_1;
  int r;
  int j;
  int i_1;
  int i;
  int a;
  int s;
  double aux;
  double sum;
  key_type_conflict *in_stack_ffffffffffffff88;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  *in_stack_ffffffffffffff90;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Collimator::getNbAngles(*(Collimator **)(in_RDI + 0xf8));
    if (iVar1 <= local_1c) break;
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x100); local_20 = local_20 + 1) {
      local_10 = 0.0;
      local_24 = 0;
      while( true ) {
        iVar1 = Collimator::getIntensityLevelSize((Collimator *)0x13d737);
        if (iVar1 <= local_24) break;
        pvVar2 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                           ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)(in_RDI + 0x70)
                            ,(long)local_1c);
        pdVar3 = maths::Matrix::operator()(pvVar2,local_20,local_24);
        dVar5 = pow(*pdVar3,*(double *)(in_RDI + 0xb8));
        pvVar2 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                           ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)(in_RDI + 0x88)
                            ,(long)local_1c);
        pdVar3 = maths::Matrix::operator()(pvVar2,local_20,local_24);
        dVar6 = pow(*pdVar3,*(double *)(in_RDI + 0xc0));
        local_10 = dVar5 * dVar6 + local_10;
        local_24 = local_24 + 1;
      }
      local_18 = (map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                  *)0x0;
      local_28 = 0;
      while( true ) {
        iVar1 = Collimator::getIntensityLevelSize((Collimator *)0x13d850);
        if (iVar1 <= local_28) break;
        pvVar2 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                           ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)(in_RDI + 0x70)
                            ,(long)local_1c);
        pdVar3 = maths::Matrix::operator()(pvVar2,local_20,local_28);
        in_stack_ffffffffffffff88 = (key_type_conflict *)pow(*pdVar3,*(double *)(in_RDI + 0xb8));
        pvVar2 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                           ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)(in_RDI + 0x88)
                            ,(long)local_1c);
        pdVar3 = maths::Matrix::operator()(pvVar2,local_20,local_28);
        dVar5 = pow(*pdVar3,*(double *)(in_RDI + 0xc0));
        dVar5 = (double)local_18 + ((double)in_stack_ffffffffffffff88 * dVar5) / local_10;
        pvVar2 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                           ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)(in_RDI + 0xa0)
                            ,(long)local_1c);
        pdVar3 = maths::Matrix::operator()(pvVar2,local_20,local_28);
        *pdVar3 = dVar5;
        pvVar2 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                           ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)(in_RDI + 0xa0)
                            ,(long)local_1c);
        pdVar3 = maths::Matrix::operator()(pvVar2,local_20,local_28);
        local_28 = local_28 + 1;
        in_stack_ffffffffffffff90 = local_18;
        local_18 = (map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                    *)*pdVar3;
      }
      local_2c = 0;
      while( true ) {
        iVar1 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xf8));
        if (iVar1 <= local_2c) break;
        local_10 = 0.0;
        local_30 = 0;
        while( true ) {
          iVar1 = Collimator::getReferenceSize(*(Collimator **)(in_RDI + 0xf8));
          if (iVar1 <= local_30) break;
          std::
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                        *)(in_RDI + 0x28),(long)local_1c);
          pmVar4 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          pdVar3 = maths::Matrix::operator()(pmVar4,local_2c,local_30);
          dVar5 = pow(*pdVar3,*(double *)(in_RDI + 0xb8));
          std::
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                        *)(in_RDI + 0x40),(long)local_1c);
          pmVar4 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          pdVar3 = maths::Matrix::operator()(pmVar4,local_2c,local_30);
          dVar6 = pow(*pdVar3,*(double *)(in_RDI + 0xc0));
          local_10 = dVar5 * dVar6 + local_10;
          local_30 = local_30 + 1;
        }
        local_18 = (map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                    *)0x0;
        local_34 = 0;
        while( true ) {
          iVar1 = Collimator::getReferenceSize(*(Collimator **)(in_RDI + 0xf8));
          if (iVar1 <= local_34) break;
          std::
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                        *)(in_RDI + 0x28),(long)local_1c);
          pmVar4 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          pdVar3 = maths::Matrix::operator()(pmVar4,local_2c,local_34);
          dVar5 = pow(*pdVar3,*(double *)(in_RDI + 0xb8));
          std::
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                        *)(in_RDI + 0x40),(long)local_1c);
          pmVar4 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          pdVar3 = maths::Matrix::operator()(pmVar4,local_2c,local_34);
          dVar6 = pow(*pdVar3,*(double *)(in_RDI + 0xc0));
          std::
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                        *)(in_RDI + 0x58),(long)local_1c);
          pmVar4 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          pdVar3 = maths::Matrix::operator()(pmVar4,local_2c,local_34);
          *pdVar3 = (double)local_18 + (dVar5 * dVar6) / local_10;
          std::
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                        *)(in_RDI + 0x58),(long)local_1c);
          pmVar4 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          pdVar3 = maths::Matrix::operator()(pmVar4,local_2c,local_34);
          local_18 = (map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                      *)*pdVar3;
          local_34 = local_34 + 1;
        }
        local_2c = local_2c + 1;
      }
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void ACS::calculateProbability (){
    double sum, aux;
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      for (int a = 0; a < max_apertures; a++ ){
        // Intensity probability
        sum = 0;
        for (int i=0; i< collimator.getIntensityLevelSize(); i++) {
          sum = sum + pow(ipheromone[s](a,i),alpha)*pow(iheuristic[s](a,i),beta);
        }
        aux=0;
        for (int i=0; i< collimator.getIntensityLevelSize(); i++) {
          iprobability[s](a,i) = aux + (pow(ipheromone[s](a,i),alpha)*pow(iheuristic[s](a,i),beta)/sum);
          aux = iprobability[s](a,i);
        }
        // Aperture probability
        for (int j = 0; j < collimator.getXdim(); j++) {
          sum = 0;
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            sum = sum + pow(pheromone[s][a](j,r),alpha)*pow(heuristic[s][a](j,r),beta);
          }
          aux = 0;
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            probability[s][a](j,r) = aux + pow(pheromone[s][a](j,r),alpha)*pow(heuristic[s][a](j,r),beta) / sum;;
            aux  = probability[s][a](j,r);
          }
        }
      }
    }
  }